

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  short sVar12;
  long lVar13;
  uint uVar14;
  
  if ((j->code_bits < 0x10) && (stbi__grow_buffer_unsafe(j), j->code_bits < 0x10)) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar11 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar11 == 0xff) {
    lVar13 = 0;
    do {
      lVar8 = lVar13;
      lVar13 = lVar8 + 1;
    } while (hdc->maxcode[lVar8 + 10] <= uVar14 >> 0x10);
    iVar5 = j->code_bits;
    if (lVar13 == 8) {
LAB_0010df8e:
      j->code_bits = iVar5 + -0x10;
    }
    else {
      uVar7 = (int)lVar8 + 10;
      if ((int)uVar7 <= iVar5) {
        uVar6 = stbi__bmask[lVar8 + 10];
        iVar4 = hdc->delta[lVar8 + 10];
        j->code_bits = (iVar5 - (int)lVar13) + -9;
        j->code_buffer = uVar14 << (uVar7 & 0x1f);
        uVar11 = (ulong)(int)((uVar14 >> ((byte)(0x17 - (char)lVar13) & 0x1f) & uVar6) + iVar4);
        goto LAB_0010dfee;
      }
    }
  }
  else {
    bVar1 = hdc->size[uVar11];
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
LAB_0010dfee:
      bVar1 = hdc->values[uVar11];
      data[0x20] = 0;
      data[0x21] = 0;
      data[0x22] = 0;
      data[0x23] = 0;
      data[0x24] = 0;
      data[0x25] = 0;
      data[0x26] = 0;
      data[0x27] = 0;
      data[0x28] = 0;
      data[0x29] = 0;
      data[0x2a] = 0;
      data[0x2b] = 0;
      data[0x2c] = 0;
      data[0x2d] = 0;
      data[0x2e] = 0;
      data[0x2f] = 0;
      data[0x30] = 0;
      data[0x31] = 0;
      data[0x32] = 0;
      data[0x33] = 0;
      data[0x34] = 0;
      data[0x35] = 0;
      data[0x36] = 0;
      data[0x37] = 0;
      data[0x38] = 0;
      data[0x39] = 0;
      data[0x3a] = 0;
      data[0x3b] = 0;
      data[0x3c] = 0;
      data[0x3d] = 0;
      data[0x3e] = 0;
      data[0x3f] = 0;
      data[0] = 0;
      data[1] = 0;
      data[2] = 0;
      data[3] = 0;
      data[4] = 0;
      data[5] = 0;
      data[6] = 0;
      data[7] = 0;
      data[8] = 0;
      data[9] = 0;
      data[10] = 0;
      data[0xb] = 0;
      data[0xc] = 0;
      data[0xd] = 0;
      data[0xe] = 0;
      data[0xf] = 0;
      data[0x10] = 0;
      data[0x11] = 0;
      data[0x12] = 0;
      data[0x13] = 0;
      data[0x14] = 0;
      data[0x15] = 0;
      data[0x16] = 0;
      data[0x17] = 0;
      data[0x18] = 0;
      data[0x19] = 0;
      data[0x1a] = 0;
      data[0x1b] = 0;
      data[0x1c] = 0;
      data[0x1d] = 0;
      data[0x1e] = 0;
      data[0x1f] = 0;
      iVar4 = j->code_bits;
      if (bVar1 == 0) {
        iVar5 = 0;
      }
      else {
        if (iVar4 < (int)(uint)bVar1) {
          stbi__grow_buffer_unsafe(j);
          iVar4 = j->code_bits;
        }
        uVar14 = j->code_buffer;
        iVar4 = iVar4 - (uint)bVar1;
        uVar6 = uVar14 << (bVar1 & 0x1f) | uVar14 >> 0x20 - (bVar1 & 0x1f);
        uVar7 = *(uint *)((long)stbi__bmask + (ulong)((uint)bVar1 * 4));
        iVar5 = 0;
        j->code_buffer = ~uVar7 & uVar6;
        j->code_bits = iVar4;
        if (-1 < (int)uVar14) {
          iVar5 = *(int *)((long)stbi__jbias + (ulong)((uint)bVar1 * 4));
        }
        iVar5 = iVar5 + (uVar6 & uVar7);
      }
      iVar9 = 1;
      iVar5 = iVar5 + j->img_comp[b].dc_pred;
      j->img_comp[b].dc_pred = iVar5;
      *data = (short)iVar5 * *dequant;
      do {
        if (iVar4 < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar14 = j->code_buffer;
        uVar11 = (ulong)(uVar14 >> 0x17);
        uVar2 = fac[uVar11];
        if (uVar2 == 0) {
          if (j->code_bits < 0x10) {
            stbi__grow_buffer_unsafe(j);
            uVar14 = j->code_buffer;
            uVar11 = (ulong)(uVar14 >> 0x17);
          }
          uVar11 = (ulong)hac->fast[uVar11];
          if (uVar11 == 0xff) {
            lVar13 = 0;
            do {
              lVar8 = lVar13;
              lVar13 = lVar8 + 1;
            } while (hac->maxcode[lVar8 + 10] <= uVar14 >> 0x10);
            iVar5 = j->code_bits;
            if (lVar13 == 8) goto LAB_0010df8e;
            uVar7 = (int)lVar8 + 10;
            if (iVar5 < (int)uVar7) break;
            uVar6 = stbi__bmask[lVar8 + 10];
            iVar3 = hac->delta[lVar8 + 10];
            uVar7 = uVar14 << (uVar7 & 0x1f);
            iVar4 = (iVar5 - (int)lVar13) + -9;
            j->code_bits = (iVar5 - (int)lVar13) + -9;
            j->code_buffer = uVar7;
            uVar11 = (ulong)(int)((uVar14 >> ((byte)(0x17 - (char)lVar13) & 0x1f) & uVar6) + iVar3);
          }
          else {
            bVar1 = hac->size[uVar11];
            iVar4 = j->code_bits - (uint)bVar1;
            if (j->code_bits < (int)(uint)bVar1) break;
            uVar7 = uVar14 << (bVar1 & 0x1f);
            j->code_buffer = uVar7;
            j->code_bits = iVar4;
          }
          bVar1 = hac->values[uVar11];
          uVar14 = bVar1 & 0xf;
          if ((bVar1 & 0xf) == 0) {
            if (bVar1 != 0xf0) {
              return 1;
            }
            iVar9 = iVar9 + 0x10;
          }
          else {
            lVar13 = (long)iVar9 + (ulong)(bVar1 >> 4);
            bVar1 = ""[lVar13];
            if (iVar4 < (int)uVar14) {
              stbi__grow_buffer_unsafe(j);
              uVar7 = j->code_buffer;
              iVar4 = j->code_bits;
            }
            iVar4 = iVar4 - uVar14;
            uVar10 = uVar7 << (sbyte)uVar14 | uVar7 >> 0x20 - (sbyte)uVar14;
            uVar6 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 << 2));
            j->code_buffer = ~uVar6 & uVar10;
            j->code_bits = iVar4;
            sVar12 = 0;
            if (-1 < (int)uVar7) {
              sVar12 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 << 2));
            }
            iVar9 = (int)lVar13 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar10 & (ushort)uVar6) + sVar12) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
        else {
          lVar13 = (long)iVar9 + (ulong)(uVar2 >> 4 & 0xf);
          j->code_buffer = uVar14 << (uVar2 & 0xf);
          iVar9 = (int)lVar13 + 1;
          iVar4 = j->code_bits - (uVar2 & 0xf);
          j->code_bits = iVar4;
          *(short *)((long)data + (ulong)((uint)""[lVar13] * 2)) =
               (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar13] * 2))
          ;
        }
        if (0x3f < iVar9) {
          return 1;
        }
      } while( true );
    }
  }
  stbi__g_failure_reason = "bad huffman code";
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}